

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_15417a4::Helper::MakeFilesFullPath
          (Helper *this,char *modeName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *relFiles,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *absFiles)

{
  pointer pbVar1;
  pointer pcVar2;
  char *pcVar3;
  bool bVar4;
  size_type sVar5;
  pointer pbVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string file;
  string local_120;
  Helper *local_100;
  char *local_f8;
  string *local_f0;
  string local_e8;
  string local_b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_90;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  size_type local_60;
  pointer local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  local_100 = this;
  local_f8 = modeName;
  local_f0 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this->Makefile);
  pbVar6 = (relFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (relFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 != pbVar1) {
    do {
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      pcVar2 = (pbVar6->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,pcVar2,pcVar2 + pbVar6->_M_string_length);
      sVar5 = cmGeneratorExpression::Find(&local_120);
      if (sVar5 != 0) {
        bVar4 = cmsys::SystemTools::FileIsFullPath(&local_120);
        if (!bVar4) {
          local_90.first._M_str = (local_f0->_M_dataplus)._M_p;
          local_90.first._M_len = local_f0->_M_string_length;
          local_90.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          local_e8._M_dataplus._M_p = (pointer)0x0;
          local_e8._M_string_length = 1;
          local_e8.field_2._M_allocated_capacity = (long)&local_e8.field_2 + 8;
          local_e8.field_2._M_local_buf[8] = '/';
          local_78 = 1;
          local_68 = 0;
          local_58 = (pbVar6->_M_dataplus)._M_p;
          local_60 = pbVar6->_M_string_length;
          local_50 = 0;
          views._M_len = 3;
          views._M_array = &local_90;
          local_70 = (char *)local_e8.field_2._M_allocated_capacity;
          cmCatViews(&local_b0,views);
          std::__cxx11::string::operator=((string *)&local_120,(string *)&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
        }
        if (((sVar5 == 0xffffffffffffffff) &&
            (bVar4 = cmsys::SystemTools::FileIsSymlink(&local_120), !bVar4)) &&
           (bVar4 = cmsys::SystemTools::FileIsDirectory(&local_120), pcVar3 = local_f8, bVar4)) {
          local_90.first._M_len = strlen(local_f8);
          local_90.first._M_str = pcVar3;
          local_90.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          local_78 = 0x12;
          local_70 = " given directory \"";
          local_68 = 0;
          local_58 = (pbVar6->_M_dataplus)._M_p;
          local_60 = pbVar6->_M_string_length;
          local_50 = 0;
          local_48 = 0xd;
          local_40 = "\" to install.";
          local_38 = 0;
          views_00._M_len = 4;
          views_00._M_array = &local_90;
          cmCatViews(&local_e8,views_00);
          std::__cxx11::string::_M_assign((string *)&local_100->Status->Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,
                            (ulong)(local_e8.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          return false;
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)absFiles,
                 &local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar1);
  }
  return true;
}

Assistant:

bool Helper::MakeFilesFullPath(const char* modeName,
                               const std::vector<std::string>& relFiles,
                               std::vector<std::string>& absFiles)
{
  return this->MakeFilesFullPath(
    modeName, this->Makefile->GetCurrentSourceDirectory(), relFiles, absFiles);
}